

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

uint32_t __thiscall
cppnet::BufferQueue::GetUseMemoryBlock
          (BufferQueue *this,vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *block_vec,
          uint32_t max_size)

{
  uint32_t uVar1;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *pvVar2;
  bool bVar3;
  element_type *this_00;
  undefined1 local_90 [68];
  uint32_t local_4c;
  undefined1 local_48 [4];
  uint32_t cur_len;
  shared_ptr<cppnet::BufferBlock> temp;
  uint32_t mem_len_2;
  uint32_t mem_len_1;
  void *mem_2;
  void *mem_1;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *pvStack_18;
  uint32_t max_size_local;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *block_vec_local;
  BufferQueue *this_local;
  
  mem_2 = (void *)0x0;
  _mem_len_2 = (element_type *)0x0;
  temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0;
  temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       0;
  mem_1._4_4_ = max_size;
  pvStack_18 = block_vec;
  block_vec_local = (vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *)this;
  std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::reserve(block_vec,8);
  List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)local_48);
  local_4c = 0;
  while (bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48), bVar3) {
    this_00 = std::
              __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_48);
    BufferBlock::GetUseMemoryBlock
              (this_00,&mem_2,
               (uint32_t *)
               ((long)&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 4),(void **)&mem_len_2,
               (uint32_t *)
               &temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    pvVar2 = pvStack_18;
    if (temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ != 0) {
      Iovec::Iovec((Iovec *)(local_90 + 0x20),mem_2,
                   (ulong)temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._4_4_);
      std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                (pvVar2,(Iovec *)(local_90 + 0x20));
      local_4c = temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._4_4_ + local_4c;
    }
    pvVar2 = pvStack_18;
    if ((uint)temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != 0) {
      Iovec::Iovec((Iovec *)(local_90 + 0x10),_mem_len_2,
                   (ulong)(uint)temp.
                                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi);
      std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                (pvVar2,(Iovec *)(local_90 + 0x10));
      local_4c = (uint)temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + local_4c;
    }
    bVar3 = std::operator==((shared_ptr<cppnet::BufferBlock> *)local_48,&this->_buffer_write);
    if ((bVar3) || ((mem_1._4_4_ != 0 && (mem_1._4_4_ <= local_4c)))) break;
    std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )local_48);
    ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)local_90);
    std::shared_ptr<cppnet::BufferBlock>::operator=
              ((shared_ptr<cppnet::BufferBlock> *)local_48,
               (shared_ptr<cppnet::BufferBlock> *)local_90);
    std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_90);
  }
  uVar1 = local_4c;
  std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_48);
  return uVar1;
}

Assistant:

uint32_t BufferQueue::GetUseMemoryBlock(std::vector<Iovec>& block_vec, uint32_t max_size) {
    void* mem_1 = nullptr;
    void* mem_2 = nullptr;
    uint32_t mem_len_1 = 0;
    uint32_t mem_len_2 = 0;

    block_vec.reserve(__block_vec_default_size);
    std::shared_ptr<BufferBlock> temp = _buffer_list.GetHead();
    uint32_t cur_len = 0;
    while (temp) {
        temp->GetUseMemoryBlock(mem_1, mem_len_1, mem_2, mem_len_2);
        if (mem_len_1 > 0) {
            block_vec.emplace_back(Iovec(mem_1, mem_len_1));
            cur_len += mem_len_1;
        }
        if (mem_len_2 > 0) {
            block_vec.emplace_back(Iovec(mem_2, mem_len_2));
            cur_len += mem_len_2;
        }
        if (temp == _buffer_write) {
            break;
        }
        if (max_size > 0 && cur_len >= max_size) {
            break;
        }
        temp = temp->GetNext();
    }
    return cur_len;
}